

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status wal_destroy(filemgr *file)

{
  size_t sVar1;
  filemgr *in_RDI;
  size_t num_shards;
  size_t i;
  ulong local_10;
  
  local_10 = 0;
  sVar1 = wal_get_num_shards(in_RDI);
  for (; local_10 < sVar1; local_10 = local_10 + 1) {
    pthread_spin_destroy(&in_RDI->wal->key_shards[local_10].lock);
    if (in_RDI->config->seqtree_opt == '\x01') {
      pthread_spin_destroy(&in_RDI->wal->seq_shards[local_10].lock);
    }
  }
  pthread_spin_destroy(&in_RDI->wal->lock);
  free(in_RDI->wal->key_shards);
  if (in_RDI->config->seqtree_opt == '\x01') {
    free(in_RDI->wal->seq_shards);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_destroy(struct filemgr *file)
{
    size_t i = 0;
    size_t num_shards = wal_get_num_shards(file);
    // Free all WAL shards
    for (; i < num_shards; ++i) {
        spin_destroy(&file->wal->key_shards[i].lock);
        if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
            spin_destroy(&file->wal->seq_shards[i].lock);
        }
    }
    spin_destroy(&file->wal->lock);
    free(file->wal->key_shards);
    if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
        free(file->wal->seq_shards);
    }
    return FDB_RESULT_SUCCESS;
}